

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O1

void on_read1(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  void *pvVar2;
  uv_stream_t *unaff_RBX;
  undefined8 *puVar3;
  code *pcVar4;
  ssize_t *psVar5;
  long *plVar6;
  code **__ptr;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_90;
  code *pcStack_88;
  undefined8 uStack_78;
  code *apcStack_70 [2];
  undefined8 uStack_60;
  code *pcStack_58;
  undefined8 uStack_48;
  long lStack_40;
  char *pcStack_38;
  undefined8 uStack_30;
  uv_stream_t *puStack_28;
  undefined8 local_18;
  ssize_t local_10;
  
  puVar3 = &local_18;
  local_18 = 0;
  local_10 = nread;
  if (nread < 0) {
    on_read1_cold_3();
  }
  else {
    do_write(stream,on_write);
    iVar1 = uv_read_stop(stream);
    local_10 = (ssize_t)iVar1;
    local_18 = 0;
    unaff_RBX = stream;
    if (local_10 == 0) {
      iVar1 = uv_read_start(stream,on_alloc,on_read2);
      local_10 = (ssize_t)iVar1;
      local_18 = 0;
      if (local_10 == 0) {
        read_cb_called = read_cb_called + 1;
        return;
      }
      goto LAB_001ce3b0;
    }
  }
  on_read1_cold_1();
LAB_001ce3b0:
  psVar5 = &local_10;
  on_read1_cold_2();
  pcStack_58 = (code *)0x1ce3d4;
  puStack_28 = unaff_RBX;
  pvVar2 = malloc(200);
  pcStack_38 = "1234578";
  uStack_30 = 8;
  pcStack_58 = (code *)0x1ce3fe;
  iVar1 = uv_write(pvVar2,psVar5,&pcStack_38,1,puVar3);
  lStack_40 = (long)iVar1;
  uStack_48 = 0;
  if (lStack_40 == 0) {
    return;
  }
  plVar6 = &lStack_40;
  iVar1 = (int)&uStack_48;
  pcStack_58 = on_write;
  do_write_cold_1();
  pcStack_58 = (code *)(long)iVar1;
  uStack_60 = 0;
  if (pcStack_58 == (code *)0x0) {
    free(plVar6);
    return;
  }
  pcVar4 = (code *)&uStack_60;
  apcStack_70[0] = on_read2;
  on_write_cold_1();
  uStack_78 = 0;
  apcStack_70[0] = pcVar4;
  if ((long)pcVar4 < 0) {
    pcStack_88 = (code *)0x1ce48f;
    uv_close();
    pcStack_88 = (code *)0x1ce49d;
    uv_close(&server,0);
    read_cb_called = read_cb_called + 1;
    return;
  }
  __ptr = apcStack_70;
  iVar1 = (int)&uStack_78;
  pcStack_88 = on_write_close_immediately;
  on_read2_cold_1();
  lStack_90 = (long)iVar1;
  pcStack_88 = (code *)puVar3;
  if (lStack_90 == 0) {
    uv_close(__ptr[0xb],0);
    free(__ptr);
    return;
  }
  plVar6 = &lStack_90;
  on_write_close_immediately_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(plVar6,0);
  return;
}

Assistant:

static void on_read1(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {
  ASSERT_GE(nread, 0);

  /* Do write on a half open connection to force WSAECONNABORTED (on Windows)
   * in the subsequent uv_read_start()
   */
  do_write(stream, on_write);

  ASSERT_OK(uv_read_stop(stream));

  ASSERT_OK(uv_read_start(stream, on_alloc, on_read2));

  read_cb_called++;
}